

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_tri_normdev_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_normdev)

{
  REF_CELL ref_cell_00;
  uint uVar1;
  bool bVar2;
  REF_INT local_dc;
  REF_DBL local_d8;
  REF_INT local_cc;
  int local_c8;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS status;
  REF_DBL normdev;
  REF_INT local_a8;
  REF_BOOL none_found;
  REF_INT nodes [27];
  int local_34;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_DBL *min_normdev_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_cell_00 = ref_grid->cell[3];
  normdev._4_4_ = 1;
  *min_normdev = 2.0;
  if ((node < 0) || (ref_cell_00->ref_adj->nnode <= node)) {
    local_c8 = -1;
  }
  else {
    local_c8 = ref_cell_00->ref_adj->first[node];
  }
  local_34 = local_c8;
  if (local_c8 == -1) {
    local_cc = -1;
  }
  else {
    local_cc = ref_cell_00->ref_adj->item[local_c8].ref;
  }
  nodes[0x1a] = local_cc;
  while( true ) {
    if (local_34 == -1) {
      bVar2 = normdev._4_4_ != 0;
      if (bVar2) {
        *min_normdev = -2.0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0xd3,"ref_smooth_tri_normdev_around","no triangle found, can not compute normdev");
      }
      ref_grid_local._4_4_ = (uint)bVar2;
      return ref_grid_local._4_4_;
    }
    uVar1 = ref_cell_nodes(ref_cell_00,nodes[0x1a],&local_a8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0xc6
             ,"ref_smooth_tri_normdev_around",(ulong)uVar1,"nodes");
      return uVar1;
    }
    normdev._4_4_ = 0;
    uVar1 = ref_geom_tri_norm_deviation(ref_grid,&local_a8,(REF_DBL *)&ref_private_macro_code_rss);
    if (uVar1 == 4) {
      *min_normdev = -1.5;
      return 0;
    }
    if (uVar1 != 0) break;
    if (_ref_private_macro_code_rss <= *min_normdev) {
      local_d8 = _ref_private_macro_code_rss;
    }
    else {
      local_d8 = *min_normdev;
    }
    *min_normdev = local_d8;
    local_34 = ref_cell_00->ref_adj->item[local_34].next;
    if (local_34 == -1) {
      local_dc = -1;
    }
    else {
      local_dc = ref_cell_00->ref_adj->item[local_34].ref;
    }
    nodes[0x1a] = local_dc;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0xcd,
         "ref_smooth_tri_normdev_around",(ulong)uVar1,"ref_geom_tri_norm_deviation");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_normdev_around(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *min_normdev) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL normdev;
  REF_STATUS status;

  *min_normdev = 2.0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    none_found = REF_FALSE;
    status = ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev);
    if (REF_DIV_ZERO == status) {
      *min_normdev = -1.5;
      return REF_SUCCESS;
    }
    RSS(status, "ref_geom_tri_norm_deviation");
    *min_normdev = MIN(*min_normdev, normdev);
  }

  if (none_found) {
    *min_normdev = -2.0;
    THROW("no triangle found, can not compute normdev");
  }

  return REF_SUCCESS;
}